

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceObjectBase.hpp
# Opt level: O2

void __thiscall
Diligent::
DeviceObjectBase<Diligent::ISamplerVk,_Diligent::RenderDeviceVkImpl,_Diligent::SamplerDesc>::
DeviceObjectBase(DeviceObjectBase<Diligent::ISamplerVk,_Diligent::RenderDeviceVkImpl,_Diligent::SamplerDesc>
                 *this,IReferenceCounters *pRefCounters,RenderDeviceVkImpl *pDevice,
                SamplerDesc *ObjDesc,bool bIsDeviceInternal)

{
  atomic<int> *paVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  FILTER_TYPE FVar4;
  FILTER_TYPE FVar5;
  FILTER_TYPE FVar6;
  TEXTURE_ADDRESS_MODE TVar7;
  TEXTURE_ADDRESS_MODE TVar8;
  TEXTURE_ADDRESS_MODE TVar9;
  SAMPLER_FLAGS SVar10;
  Bool BVar11;
  Float32 FVar12;
  Uint32 UVar13;
  COMPARISON_FUNCTION CVar14;
  undefined3 uVar15;
  Float32 FVar16;
  undefined4 uVar17;
  int iVar18;
  size_t sVar19;
  IMemoryAllocator *pIVar20;
  char *pcVar21;
  undefined4 extraout_var_00;
  SamplerDesc *Args_1;
  RenderDeviceVkImpl *this_00;
  string msg;
  undefined4 extraout_var;
  
  Args_1 = ObjDesc;
  ObjectBase<Diligent::ISamplerVk>::ObjectBase
            (&this->super_ObjectBase<Diligent::ISamplerVk>,pRefCounters);
  (this->super_ObjectBase<Diligent::ISamplerVk>).super_RefCountedObject<Diligent::ISamplerVk>.
  super_ISamplerVk.super_ISampler.super_IDeviceObject.super_IObject._vptr_IObject =
       (_func_int **)&PTR_QueryInterface_00896c18;
  this->m_pDevice = pDevice;
  FVar4 = ObjDesc->MinFilter;
  FVar5 = ObjDesc->MagFilter;
  FVar6 = ObjDesc->MipFilter;
  TVar7 = ObjDesc->AddressU;
  TVar8 = ObjDesc->AddressV;
  TVar9 = ObjDesc->AddressW;
  SVar10 = ObjDesc->Flags;
  BVar11 = ObjDesc->UnnormalizedCoords;
  FVar12 = ObjDesc->MipLODBias;
  UVar13 = ObjDesc->MaxAnisotropy;
  CVar14 = ObjDesc->ComparisonFunc;
  uVar15 = *(undefined3 *)&ObjDesc->field_0x19;
  FVar16 = ObjDesc->BorderColor[0];
  uVar2 = *(undefined8 *)(ObjDesc->BorderColor + 1);
  uVar3 = *(undefined8 *)(ObjDesc->BorderColor + 3);
  (this->m_Desc).super_DeviceObjectAttribs.Name = (ObjDesc->super_DeviceObjectAttribs).Name;
  (this->m_Desc).MinFilter = FVar4;
  (this->m_Desc).MagFilter = FVar5;
  (this->m_Desc).MipFilter = FVar6;
  (this->m_Desc).AddressU = TVar7;
  (this->m_Desc).AddressV = TVar8;
  (this->m_Desc).AddressW = TVar9;
  (this->m_Desc).Flags = SVar10;
  (this->m_Desc).UnnormalizedCoords = BVar11;
  (this->m_Desc).MipLODBias = FVar12;
  (this->m_Desc).MaxAnisotropy = UVar13;
  (this->m_Desc).ComparisonFunc = CVar14;
  *(undefined3 *)&(this->m_Desc).field_0x19 = uVar15;
  (this->m_Desc).BorderColor[0] = FVar16;
  *(undefined8 *)((this->m_Desc).BorderColor + 1) = uVar2;
  *(undefined8 *)((this->m_Desc).BorderColor + 3) = uVar3;
  uVar17 = *(undefined4 *)&ObjDesc->field_0x34;
  (this->m_Desc).MaxLOD = ObjDesc->MaxLOD;
  *(undefined4 *)&(this->m_Desc).field_0x34 = uVar17;
  if (pDevice == (RenderDeviceVkImpl *)0x0) {
    iVar18 = 0;
  }
  else {
    LOCK();
    paVar1 = &(pDevice->
              super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
              ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>.m_UniqueId;
    iVar18 = (paVar1->super___atomic_base<int>)._M_i;
    (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + 1;
    UNLOCK();
    iVar18 = iVar18 + 1;
  }
  this->m_UniqueID = iVar18;
  this->m_bIsDeviceInternal = bIsDeviceInternal;
  (this->m_pUserData).m_pObject = (IObject *)0x0;
  if (!bIsDeviceInternal) {
    this_00 = this->m_pDevice;
    if (this_00 == (RenderDeviceVkImpl *)0x0) {
      FormatString<char[26],char[21]>
                (&msg,(Diligent *)"Debug expression failed:\n",(char (*) [26])"m_pDevice != nullptr"
                 ,(char (*) [21])Args_1);
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"DeviceObjectBase",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceObjectBase.hpp"
                 ,0x47);
      std::__cxx11::string::~string((string *)&msg);
      this_00 = this->m_pDevice;
    }
    RefCountedObject<Diligent::IRenderDeviceVk>::AddRef
              ((RefCountedObject<Diligent::IRenderDeviceVk> *)this_00);
  }
  pcVar21 = (ObjDesc->super_DeviceObjectAttribs).Name;
  if (pcVar21 == (char *)0x0) {
    pIVar20 = GetStringAllocator();
    iVar18 = (**pIVar20->_vptr_IMemoryAllocator)
                       (pIVar20,0x13,"Object address string",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceObjectBase.hpp"
                        ,0x55);
    pcVar21 = (char *)CONCAT44(extraout_var_00,iVar18);
    snprintf(pcVar21,0x13,"0x%llX",this);
  }
  else {
    sVar19 = strlen(pcVar21);
    pIVar20 = GetStringAllocator();
    iVar18 = (**pIVar20->_vptr_IMemoryAllocator)
                       (pIVar20,sVar19 + 1,"Object name copy",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceObjectBase.hpp"
                        ,0x4e);
    pcVar21 = (char *)CONCAT44(extraout_var,iVar18);
    memcpy(pcVar21,(ObjDesc->super_DeviceObjectAttribs).Name,sVar19 + 1);
  }
  (this->m_Desc).super_DeviceObjectAttribs.Name = pcVar21;
  return;
}

Assistant:

DeviceObjectBase(IReferenceCounters*   pRefCounters,
                     RenderDeviceImplType* pDevice,
                     const ObjectDescType& ObjDesc,
                     bool                  bIsDeviceInternal = false) :
        // clang-format off
        TBase              {pRefCounters},
        m_pDevice          {pDevice          },
        m_Desc             {ObjDesc          },
        m_UniqueID         {pDevice != nullptr ? pDevice->GenerateUniqueId() : 0},
        m_bIsDeviceInternal{bIsDeviceInternal}
    //clang-format on
    {
        // Do not keep strong reference to the device if the object is an internal device object
        if (!m_bIsDeviceInternal)
        {
            // Device can be null if object is used for serialization
            VERIFY_EXPR(m_pDevice != nullptr);
            m_pDevice->AddRef();
        }

        if (ObjDesc.Name != nullptr)
        {
            size_t  size     = strlen(ObjDesc.Name) + 1;
            char* NameCopy = ALLOCATE(GetStringAllocator(), "Object name copy", char, size);
            memcpy(NameCopy, ObjDesc.Name, size);
            m_Desc.Name = NameCopy;
        }
        else
        {
            size_t size       = 16 + 2 + 1; // 0x12345678
            char*  AddressStr = ALLOCATE(GetStringAllocator(), "Object address string", char, size);
            snprintf(AddressStr, size, "0x%llX", static_cast<unsigned long long>(reinterpret_cast<size_t>(this)));
            m_Desc.Name = AddressStr;
        }

        //                        !!!WARNING!!!
        // We cannot add resource to the hash table from here, because the object
        // has not been completely created yet and the reference counters object
        // is not initialized!
        //m_pDevice->AddResourceToHash( this ); - ERROR!
    }